

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O1

void __thiscall leveldb::anon_unknown_0::MergingIterator::Seek(MergingIterator *this,Slice *target)

{
  long lVar1;
  long lVar2;
  
  if (0 < this->n_) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      IteratorWrapper::Seek((IteratorWrapper *)((long)&this->children_->iter_ + lVar2),target);
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x20;
    } while (lVar1 < this->n_);
  }
  FindSmallest(this);
  this->direction_ = kForward;
  return;
}

Assistant:

void Seek(const Slice& target) override {
    for (int i = 0; i < n_; i++) {
      children_[i].Seek(target);
    }
    FindSmallest();
    direction_ = kForward;
  }